

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadePrimitives
          (VertexVaryingShader *this,GeometryEmitter *output,int verticesIn,PrimitivePacket *packets
          ,int numPackets,int invocationID)

{
  int iVar1;
  VertexPacket *pVVar2;
  VertexPacket **ppVVar3;
  PrimitivePacket *pPVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector<float,_4> res;
  ulong local_90;
  Vec4 local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  PrimitivePacket *local_58;
  ulong local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (*(int *)&(this->super_ShaderProgram).field_0x154 == -1) {
    local_68 = 0;
    uStack_60 = 0;
    _local_78 = 0;
    _fStack_70 = 0;
    if (this->m_geometryOut == 2) {
      _local_78 = 0x3f000000;
      _fStack_70 = 0x3f00000000000000;
      local_68 = 0x3f00000000000000;
      uStack_60 = 0x3f00000000000000;
    }
    else if (this->m_geometryOut == 1) {
      _local_78 = 0x3f800000;
      _fStack_70 = 0x3f80000000000000;
    }
    if (0 < numPackets) {
      lVar6 = 0;
      do {
        local_88.m_data[0] = -0.2;
        local_88.m_data[1] = -0.2;
        local_88.m_data[2] = 0.0;
        local_88.m_data[3] = 1.0;
        rr::GeometryEmitter::EmitVertex
                  (output,&local_88,1.0,(GenericVec4 *)&local_78,
                   *(int *)((long)packets->vertices + lVar6 + -8));
        local_88.m_data[0] = 0.8;
        local_88.m_data[1] = -0.2;
        local_88.m_data[2] = 0.0;
        local_88.m_data[3] = 1.0;
        rr::GeometryEmitter::EmitVertex
                  (output,&local_88,1.0,(GenericVec4 *)&local_78,
                   *(int *)((long)packets->vertices + lVar6 + -8));
        local_88.m_data[0] = 0.8;
        local_88.m_data[1] = 0.8;
        local_88.m_data[2] = 0.0;
        local_88.m_data[3] = 1.0;
        rr::GeometryEmitter::EmitVertex
                  (output,&local_88,1.0,(GenericVec4 *)&local_78,
                   *(int *)((long)packets->vertices + lVar6 + -8));
        rr::GeometryEmitter::EndPrimitive(output);
        lVar6 = lVar6 + 0x38;
      } while ((ulong)(uint)numPackets * 0x38 - lVar6 != 0);
    }
  }
  else if (0 < numPackets) {
    local_50 = (ulong)(uint)numPackets;
    ppVVar3 = packets->vertices;
    local_90 = 0;
    local_48 = 0.5;
    fStack_44 = 0.5;
    fStack_40 = 0.5;
    fStack_3c = 0.5;
    local_58 = packets;
    do {
      if (0 < verticesIn) {
        pPVar4 = local_58 + local_90;
        uVar5 = 0;
        do {
          local_68 = 0;
          uStack_60 = 0;
          _local_78 = 0;
          _fStack_70 = 0;
          iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
          if (iVar1 == 2) {
            pVVar2 = ppVVar3[uVar5];
            fVar7 = pVVar2[1].position.m_data[0] * local_48 + pVVar2->outputs[0].v.fData[0] * 0.5;
            fVar8 = (float)pVVar2[1].vertexNdx * fStack_44 + pVVar2->outputs[0].v.fData[1] * 0.5;
            fVar9 = (float)pVVar2[1].instanceNdx * fStack_40 + pVVar2->outputs[0].v.fData[2] * 0.5;
            fVar10 = pVVar2[1].position.m_data[1] * fStack_3c + pVVar2->outputs[0].v.fData[3] * 0.5;
          }
          else if (iVar1 == 1) {
            pVVar2 = ppVVar3[uVar5];
            fVar7 = pVVar2->outputs[0].v.fData[0];
            fVar8 = pVVar2->outputs[0].v.fData[1];
            fVar9 = pVVar2->outputs[0].v.fData[2];
            fVar10 = pVVar2->outputs[0].v.fData[3];
          }
          else {
            fVar7 = 0.0;
            fVar8 = 0.0;
            fVar9 = 0.0;
            fVar10 = 0.0;
            if (iVar1 == 0) {
              fVar7 = 1.0;
              fVar8 = 0.0;
              fVar9 = 0.0;
              fVar10 = 1.0;
            }
          }
          if (this->m_geometryOut == 2) {
            fStack_74 = fVar8 * 0.5;
            local_78 = fVar7 * 0.5;
            fStack_6c = fVar10 * 0.5;
            fStack_70 = fVar9 * 0.5;
            local_68 = CONCAT44(fVar7 * 0.5,fVar8 * 0.5);
            uStack_60 = CONCAT44(fVar10 * 0.5,fVar9 * 0.5);
          }
          else if (this->m_geometryOut == 1) {
            fStack_74 = fVar8;
            local_78 = fVar7;
            fStack_6c = fVar10;
            fStack_70 = fVar9;
          }
          pVVar2 = ppVVar3[uVar5];
          local_88.m_data[1] = (pVVar2->position).m_data[1] + -0.2;
          local_88.m_data[0] = (pVVar2->position).m_data[0] + -0.2;
          local_88.m_data[3] = (pVVar2->position).m_data[3] + 0.0;
          local_88.m_data[2] = (pVVar2->position).m_data[2] + 0.0;
          rr::GeometryEmitter::EmitVertex
                    (output,&local_88,pVVar2->pointSize,(GenericVec4 *)&local_78,
                     pPVar4->primitiveIDIn);
          uVar5 = uVar5 + 1;
        } while ((uint)verticesIn != uVar5);
      }
      rr::GeometryEmitter::EndPrimitive(output);
      local_90 = local_90 + 1;
      ppVVar3 = ppVVar3 + 7;
    } while (local_90 != local_50);
  }
  return;
}

Assistant:

void VertexVaryingShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(invocationID);

	const tcu::Vec4 vertexOffset(-0.2f, -0.2f, 0, 0);

	if (m_vertexOut == -1)
	{
		// vertex is a no-op
		const tcu::Vec4 inputColor = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
		rr::GenericVec4	outputs[2];

		// output color
		switch (m_geometryOut)
		{
			case 0:
				break;

			case 1:
				outputs[0] = inputColor;
				break;

			case 2:
				outputs[0] = inputColor * 0.5f;
				outputs[1] = inputColor.swizzle(1, 0, 2, 3) * 0.5f;
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		for (int ndx = 0; ndx < numPackets; ++ndx)
		{
			output.EmitVertex(tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EmitVertex(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EmitVertex(tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EndPrimitive();
		}
	}
	else
	{
		// vertex is not a no-op
		for (int ndx = 0; ndx < numPackets; ++ndx)
		{
			for (int verticeNdx = 0; verticeNdx < verticesIn; ++verticeNdx)
			{
				tcu::Vec4		inputColor;
				rr::GenericVec4	outputs[2];

				// input color
				switch (m_vertexOut)
				{
					case 0:
						inputColor = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
						break;

					case 1:
						inputColor = packets[ndx].vertices[verticeNdx]->outputs[0].get<float>();
						break;

					case 2:
						inputColor = (packets[ndx].vertices[verticeNdx]->outputs[0].get<float>() * 0.5f)
								   + (packets[ndx].vertices[verticeNdx]->outputs[1].get<float>().swizzle(2, 1, 0, 3) * 0.5f);
						break;

					default:
						DE_ASSERT(DE_FALSE);
				}

				// output color
				switch (m_geometryOut)
				{
					case 0:
						break;

					case 1:
						outputs[0] = inputColor;
						break;

					case 2:
						outputs[0] = inputColor * 0.5f;
						outputs[1] = inputColor.swizzle(1, 0, 2, 3) * 0.5f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
				}

				output.EmitVertex(packets[ndx].vertices[verticeNdx]->position + vertexOffset, packets[ndx].vertices[verticeNdx]->pointSize, outputs, packets[ndx].primitiveIDIn);
			}
			output.EndPrimitive();
		}
	}
}